

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::BottomLevelASVkImpl::BottomLevelASVkImpl
          (BottomLevelASVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,BottomLevelASDesc *Desc)

{
  BottomLevelASDesc *Args_1;
  VulkanPhysicalDevice *this_00;
  VulkanLogicalDevice *this_01;
  BLASTriangleDesc *pBVar1;
  BLASBoundingBoxDesc *pBVar2;
  VkDeviceSize VVar3;
  pointer pVVar4;
  VkFormat VVar5;
  VkIndexType VVar6;
  VkAccelerationStructureTypeKHR VVar7;
  uint32_t MemoryTypeIndex;
  VkResult errorCode;
  Uint32 *pUVar8;
  Uint64 UVar9;
  VkDeviceAddress VVar10;
  void **ppvVar11;
  ulong uVar12;
  char *Args_2;
  char (*in_stack_fffffffffffffe88) [35];
  VkMemoryRequirements MemReqs;
  uint local_148;
  Uint32 MaxPrimitiveCount;
  string msg_1;
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  vkGeometries;
  VkAccelerationStructureCreateInfoKHR vkAccelStrCI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> MaxPrimitiveCounts;
  Char *local_70;
  VkBufferCreateInfo vkBuffCI;
  
  BottomLevelASBase<Diligent::EngineVkImplTraits>::BottomLevelASBase
            (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,pRefCounters,
             pRenderDeviceVk,Desc,false);
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  .super_ObjectBase<Diligent::IBottomLevelASVk>.super_RefCountedObject<Diligent::IBottomLevelASVk>.
  super_IBottomLevelASVk.super_IBottomLevelAS.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00b023f8;
  this->m_DeviceAddress = 0;
  (this->m_VulkanBLAS).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VulkanBLAS).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VulkanBLAS).m_VkObject = (VkAccelerationStructureKHR_T *)0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_VulkanBuffer).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_VulkanBuffer).m_VkObject = (VkBuffer_T *)0x0;
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)0x0;
  (this->m_MemoryAllocation).UnalignedOffset = 0;
  (this->m_MemoryAllocation).Size = 0;
  this->m_MemoryAlignedOffset = 0;
  this_00 = (pRenderDeviceVk->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  this_01 = (pRenderDeviceVk->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  UVar9 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
          .m_Desc.CompactedSize;
  if (UVar9 != 0) goto LAB_0027f4ad;
  vkAccelStrCI.type = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
  vkAccelStrCI._52_4_ = 0;
  vkAccelStrCI.deviceAddress = 0;
  vkAccelStrCI.offset = 0;
  vkAccelStrCI.size = 0;
  vkAccelStrCI.createFlags = 0;
  vkAccelStrCI._20_4_ = 0;
  vkAccelStrCI.buffer = (VkBuffer)0x0;
  vkAccelStrCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkAccelStrCI._4_4_ = 0;
  vkAccelStrCI.pNext = (void *)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vkGeometries.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vkBuffCI.pNext = (void *)0x0;
  vkBuffCI.usage = 0;
  vkBuffCI.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  vkBuffCI.flags = 0;
  vkBuffCI._20_4_ = 0;
  vkBuffCI.size = 0;
  vkBuffCI.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;
  vkBuffCI._4_4_ = 0;
  std::
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>::
  resize(&vkGeometries,(ulong)Desc->BoxCount + (ulong)Desc->TriangleCount);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&MaxPrimitiveCounts,
             ((long)vkGeometries.
                    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)vkGeometries.
                    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
  if ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
      .m_Desc.pTriangles == (BLASTriangleDesc *)0x0) {
    pBVar2 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
             .m_Desc.pBoxes;
    if (pBVar2 == (BLASBoundingBoxDesc *)0x0) {
      FormatString<char[45]>
                ((string *)&MemReqs,(char (*) [45])"Either pTriangles or pBoxes must not be null");
      DebugAssertionFailed
                ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                 ,0x81);
    }
    else {
      msg_1._M_dataplus._M_p = msg_1._M_dataplus._M_p & 0xffffffff00000000;
      if ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
          .m_Desc.BoxCount != 0) {
        pUVar8 = &pBVar2->MaxBoxCount;
        ppvVar11 = &((vkGeometries.
                      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                      ._M_impl.super__Vector_impl_data._M_start)->geometry).triangles.pNext;
        uVar12 = 0;
        do {
          *(undefined4 *)(ppvVar11 + -4) = 0x3b9d13f6;
          ppvVar11[-3] = (void *)0x0;
          *(undefined4 *)(ppvVar11 + -2) = 1;
          ((VkAccelerationStructureGeometryTrianglesDataKHR *)(ppvVar11 + -1))->sType =
               VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
          *ppvVar11 = (void *)0x0;
          MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start[uVar12] = *pUVar8;
          msg_1._M_dataplus._M_p._0_4_ = (uint)msg_1._M_dataplus._M_p + *pUVar8;
          uVar12 = uVar12 + 1;
          pUVar8 = pUVar8 + 4;
          ppvVar11 = ppvVar11 + 0xc;
        } while (uVar12 < (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                          .m_Desc.BoxCount);
      }
      if ((uint)msg_1._M_dataplus._M_p <=
          (pRenderDeviceVk->
          super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
          ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
          MaxPrimitivesPerBLAS) goto LAB_0027f370;
      FormatString<char[16],unsigned_int,char[25],unsigned_int,char[2]>
                ((string *)&MemReqs,(Diligent *)"Max box count (",(char (*) [16])&msg_1,
                 (uint *)") exceeds device limit (",
                 (char (*) [25])
                 &(pRenderDeviceVk->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                  MaxPrimitivesPerBLAS,(uint *)0x930f15,(char (*) [2])in_stack_fffffffffffffe88);
      DebugAssertionFailed
                ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                 ,0x7c);
    }
LAB_0027f355:
    if ((uint32_t *)MemReqs.size != &MemReqs.memoryTypeBits) {
      operator_delete((void *)MemReqs.size,MemReqs._16_8_ + 1);
    }
  }
  else {
    MaxPrimitiveCount = 0;
    local_148 = 0;
    if ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
        .m_Desc.TriangleCount != 0) {
      do {
        pVVar4 = vkGeometries.
                 super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar1 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                 .m_Desc.pTriangles;
        uVar12 = (ulong)local_148;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar12].sType =
             VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar12].pNext = (void *)0x0;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar12].geometryType =
             VK_GEOMETRY_TYPE_TRIANGLES_KHR;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar12].flags = 0;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar12].geometry.triangles.sType =
             VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
        vkGeometries.
        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar12].geometry.triangles.pNext = (void *)0x0;
        VVar5 = TypeToVkFormat(pBVar1[uVar12].VertexValueType,
                               (uint)pBVar1[uVar12].VertexComponentCount,
                               pBVar1[uVar12].VertexValueType < VT_FLOAT16);
        pVVar4[uVar12].geometry.triangles.vertexFormat = VVar5;
        if (pBVar1[uVar12].MaxVertexCount == 0) {
          FormatString<char[38]>
                    ((string *)&MemReqs,(char (*) [38])"MaxVertexCount must be greater than 0");
          DebugAssertionFailed
                    ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                     ,0x4b);
          if ((uint32_t *)MemReqs.size != &MemReqs.memoryTypeBits) {
            operator_delete((void *)MemReqs.size,MemReqs._16_8_ + 1);
          }
        }
        pVVar4[uVar12].geometry.triangles.maxVertex = pBVar1[uVar12].MaxVertexCount - 1;
        VVar6 = TypeToVkIndexType(pBVar1[uVar12].IndexType);
        pVVar4[uVar12].geometry.triangles.indexType = VVar6;
        *(ulong *)((long)&pVVar4[uVar12].geometry + 0x38) = (ulong)pBVar1[uVar12].AllowsTransforms;
        MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[local_148] = pBVar1[uVar12].MaxPrimitiveCount;
        MaxPrimitiveCount = MaxPrimitiveCount + pBVar1[uVar12].MaxPrimitiveCount;
        MemReqs.alignment = 0;
        MemReqs.memoryTypeBits = 0;
        MemReqs._20_4_ = 0;
        MemReqs.size = 0x3b9bb07a;
        (*vkGetPhysicalDeviceFormatProperties2KHR)
                  (this_00->m_VkDevice,pVVar4[uVar12].geometry.triangles.vertexFormat,
                   (VkFormatProperties2 *)&MemReqs);
        local_70 = GetValueTypeString(pBVar1[uVar12].VertexValueType);
        FormatString<char[27],unsigned_int,char[20],char_const*,char[18],unsigned_int,char[25],unsigned_char,char[35]>
                  (&msg_1,(Diligent *)"combination of pTriangles[",(char (*) [27])&local_148,
                   (uint *)"].VertexValueType (",(char (*) [20])&local_70,
                   (char **)") and pTriangles[",(char (*) [18])&local_148,
                   (uint *)"].VertexComponentCount (",
                   (char (*) [25])&pBVar1[uVar12].VertexComponentCount,
                   (uchar *)") is not supported by this device.",in_stack_fffffffffffffe88);
        DebugAssertionFailed
                  (msg_1._M_dataplus._M_p,"BottomLevelASVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                   ,0x5d);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg_1._M_dataplus._M_p != &msg_1.field_2) {
          operator_delete(msg_1._M_dataplus._M_p,msg_1.field_2._M_allocated_capacity + 1);
        }
        local_148 = local_148 + 1;
      } while (local_148 <
               (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
               .m_Desc.TriangleCount);
    }
    if ((pRenderDeviceVk->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
        MaxPrimitivesPerBLAS < MaxPrimitiveCount) {
      FormatString<char[23],unsigned_int,char[25],unsigned_int,char[2]>
                ((string *)&MemReqs,(Diligent *)"Max primitives count (",
                 (char (*) [23])&MaxPrimitiveCount,(uint *)") exceeds device limit (",
                 (char (*) [25])
                 &(pRenderDeviceVk->
                  super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                  ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                  MaxPrimitivesPerBLAS,(uint *)0x930f15,(char (*) [2])in_stack_fffffffffffffe88);
      DebugAssertionFailed
                ((Char *)MemReqs.size,"BottomLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                 ,0x65);
      goto LAB_0027f355;
    }
  }
LAB_0027f370:
  vkAccelStrCI.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
  vkAccelStrCI._20_4_ =
       BuildASFlagsToVkBuildAccelerationStructureFlags
                 ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                  .m_Desc.Flags);
  vkAccelStrCI.createFlags = 1;
  vkAccelStrCI.deviceAddress =
       (VkDeviceAddress)
       vkGeometries.
       super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
       ._M_impl.super__Vector_impl_data._M_start;
  VVar7 = (int)((ulong)((long)vkGeometries.
                              super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)vkGeometries.
                             super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555;
  vkAccelStrCI.type = VVar7;
  if ((pRenderDeviceVk->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
      MaxGeometriesPerBLAS < VVar7) {
    FormatString<char[17],unsigned_int,char[25],unsigned_int,char[3]>
              ((string *)&MemReqs,(Diligent *)"Geometry count (",(char (*) [17])&vkAccelStrCI.type,
               (uint *)") exceeds device limit (",
               (char (*) [25])
               &(pRenderDeviceVk->
                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
                MaxGeometriesPerBLAS,(uint *)0x930cd5,(char (*) [3])in_stack_fffffffffffffe88);
    DebugAssertionFailed
              ((Char *)MemReqs.size,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0x8b);
    if ((uint32_t *)MemReqs.size != &MemReqs.memoryTypeBits) {
      operator_delete((void *)MemReqs.size,MemReqs._16_8_ + 1);
    }
  }
  VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureBuildSizes
            (this_01,(VkAccelerationStructureBuildGeometryInfoKHR *)&vkAccelStrCI,
             MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (VkAccelerationStructureBuildSizesInfoKHR *)&vkBuffCI);
  UVar9 = vkBuffCI._16_8_;
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize.Build =
       vkBuffCI._32_8_;
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize.Update = vkBuffCI.size
  ;
  if (MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(MaxPrimitiveCounts.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)MaxPrimitiveCounts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)MaxPrimitiveCounts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vkGeometries.
      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkGeometries.
                    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vkGeometries.
                          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkGeometries.
                          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0027f4ad:
  Args_1 = &(this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
            .m_Desc;
  vkBuffCI.pNext = (void *)0x0;
  vkBuffCI.pQueueFamilyIndices = (uint32_t *)0x0;
  vkBuffCI.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  vkBuffCI._4_4_ = 0;
  vkBuffCI.flags = 0;
  vkBuffCI._20_4_ = 0;
  vkBuffCI.usage = 0x120000;
  vkBuffCI.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  vkBuffCI.queueFamilyIndexCount = 0;
  vkBuffCI._44_4_ = 0;
  vkBuffCI.size = UVar9;
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&vkAccelStrCI,this_01,&vkBuffCI,
             (Args_1->super_DeviceObjectAttribs).Name);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(&this->m_VulkanBuffer,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
            &vkAccelStrCI);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
             &vkAccelStrCI);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            (&MemReqs,this_01,(this->m_VulkanBuffer).m_VkObject);
  MemoryTypeIndex =
       VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex(this_00,MemReqs.memoryTypeBits,1);
  if ((MemReqs.alignment ^ MemReqs.alignment - 1) <= MemReqs.alignment - 1) {
    FormatString<char[29]>((string *)&vkAccelStrCI,(char (*) [29])"Alignment is not power of 2!");
    DebugAssertionFailed
              ((Char *)vkAccelStrCI._0_8_,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa2);
    if ((VkAccelerationStructureCreateFlagsKHR *)vkAccelStrCI._0_8_ != &vkAccelStrCI.createFlags) {
      operator_delete((void *)vkAccelStrCI._0_8_,vkAccelStrCI._16_8_ + 1);
    }
  }
  Args_2 = (char *)(ulong)MemoryTypeIndex;
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)&vkAccelStrCI,pRenderDeviceVk,MemReqs.size,MemReqs.alignment,
             MemoryTypeIndex,2);
  (this->m_MemoryAllocation).Page = (VulkanMemoryPage *)vkAccelStrCI._0_8_;
  (this->m_MemoryAllocation).UnalignedOffset = (VkDeviceSize)vkAccelStrCI.pNext;
  (this->m_MemoryAllocation).Size = vkAccelStrCI._16_8_;
  vkAccelStrCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkAccelStrCI._4_4_ = 0;
  vkAccelStrCI.pNext = (void *)0x0;
  vkAccelStrCI.createFlags = 0;
  vkAccelStrCI._20_4_ = 0;
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation
            ((VulkanMemoryAllocation *)&vkAccelStrCI);
  if ((this->m_MemoryAllocation).Page == (VulkanMemoryPage *)0x0) {
    Args_2 = "Failed to allocate memory for BLAS \'";
    LogError<true,char[37],char_const*,char[3]>
              (false,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa5,(char (*) [37])"Failed to allocate memory for BLAS \'",(char **)Args_1,
               (char (*) [3])"\'.");
  }
  VVar3 = (this->m_MemoryAllocation).UnalignedOffset;
  msg_1._M_dataplus._M_p = (pointer)MemReqs.alignment;
  if ((MemReqs.alignment ^ MemReqs.alignment - 1) <= MemReqs.alignment - 1) {
    FormatString<char[12],unsigned_long,char[23]>
              ((string *)&vkAccelStrCI,(Diligent *)"Alignment (",(char (*) [12])&msg_1,
               (unsigned_long *)") must be a power of 2",(char (*) [23])Args_2);
    DebugAssertionFailed
              ((Char *)vkAccelStrCI._0_8_,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((VkAccelerationStructureCreateFlagsKHR *)vkAccelStrCI._0_8_ != &vkAccelStrCI.createFlags) {
      operator_delete((void *)vkAccelStrCI._0_8_,vkAccelStrCI._16_8_ + 1);
    }
  }
  this->m_MemoryAlignedOffset =
       -(long)msg_1._M_dataplus._M_p & (ulong)(msg_1._M_dataplus._M_p + (VVar3 - 1));
  if ((this->m_MemoryAllocation).Size <
      ((-(long)msg_1._M_dataplus._M_p & (ulong)(msg_1._M_dataplus._M_p + (VVar3 - 1))) +
      MemReqs.size) - (this->m_MemoryAllocation).UnalignedOffset) {
    FormatString<char[39]>
              ((string *)&vkAccelStrCI,(char (*) [39])"Size of memory allocation is too small");
    DebugAssertionFailed
              ((Char *)vkAccelStrCI._0_8_,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa8);
    if ((VkAccelerationStructureCreateFlagsKHR *)vkAccelStrCI._0_8_ != &vkAccelStrCI.createFlags) {
      operator_delete((void *)vkAccelStrCI._0_8_,vkAccelStrCI._16_8_ + 1);
    }
  }
  errorCode = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_01,(this->m_VulkanBuffer).m_VkObject,
                         (((this->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject,
                         this->m_MemoryAlignedOffset);
  if (errorCode != VK_SUCCESS) {
    vkAccelStrCI._0_8_ = VulkanUtilities::VkResultToString(errorCode);
    LogError<true,char[29],char[17],char_const*>
              (false,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xab,(char (*) [29])"Failed to bind buffer memory",
               (char (*) [17])"\nVK Error Code: ",(char **)&vkAccelStrCI);
  }
  vkAccelStrCI.pNext = (void *)0x0;
  vkAccelStrCI.deviceAddress = 0;
  vkAccelStrCI.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
  vkAccelStrCI._4_4_ = 0;
  vkAccelStrCI.createFlags = 0;
  vkAccelStrCI._20_4_ = 0;
  vkAccelStrCI.buffer = (this->m_VulkanBuffer).m_VkObject;
  vkAccelStrCI.offset = 0;
  vkAccelStrCI.type = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;
  vkAccelStrCI._52_4_ = 0;
  vkAccelStrCI.size = UVar9;
  VulkanUtilities::VulkanLogicalDevice::CreateAccelStruct
            ((AccelStructWrapper *)&msg_1,this_01,&vkAccelStrCI,
             (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  operator=(&this->m_VulkanBLAS,
            (VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
             *)&msg_1);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>
              *)&msg_1);
  VVar10 = VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress
                     (this_01,(this->m_VulkanBLAS).m_VkObject);
  this->m_DeviceAddress = VVar10;
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_State =
       RESOURCE_STATE_BUILD_AS_READ;
  return;
}

Assistant:

BottomLevelASVkImpl::BottomLevelASVkImpl(IReferenceCounters*      pRefCounters,
                                         RenderDeviceVkImpl*      pRenderDeviceVk,
                                         const BottomLevelASDesc& Desc) :
    TBottomLevelASBase{pRefCounters, pRenderDeviceVk, Desc}
{
    const auto& LogicalDevice   = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    const auto& RTProps         = pRenderDeviceVk->GetAdapterInfo().RayTracing;
    auto        AccelStructSize = m_Desc.CompactedSize;

    if (AccelStructSize == 0)
    {
        VkAccelerationStructureBuildGeometryInfoKHR     vkBuildInfo{};
        std::vector<VkAccelerationStructureGeometryKHR> vkGeometries;
        std::vector<uint32_t>                           MaxPrimitiveCounts;
        VkAccelerationStructureBuildSizesInfoKHR        vkSizeInfo{};
        vkSizeInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;

        vkGeometries.resize(size_t{Desc.TriangleCount} + size_t{Desc.BoxCount});
        MaxPrimitiveCounts.resize(vkGeometries.size());

        if (m_Desc.pTriangles != nullptr)
        {
            Uint32 MaxPrimitiveCount = 0;
            for (uint32_t i = 0; i < m_Desc.TriangleCount; ++i)
            {
                auto& src = m_Desc.pTriangles[i];
                auto& dst = vkGeometries[i];
                auto& tri = dst.geometry.triangles;

                dst.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
                dst.pNext        = nullptr;
                dst.geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
                dst.flags        = 0;

                tri.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
                tri.pNext        = nullptr;
                tri.vertexFormat = TypeToVkFormat(src.VertexValueType, src.VertexComponentCount, src.VertexValueType < VT_FLOAT16);
                // maxVertex is the number of vertices in vertexData minus one.
                VERIFY(src.MaxVertexCount > 0, "MaxVertexCount must be greater than 0");
                tri.maxVertex = src.MaxVertexCount - 1;
                tri.indexType = TypeToVkIndexType(src.IndexType);
                // Non-null address indicates that non-null transform data will be provided to the build command.
                tri.transformData.deviceAddress = src.AllowsTransforms ? 1 : 0;
                MaxPrimitiveCounts[i]           = src.MaxPrimitiveCount;

                MaxPrimitiveCount += src.MaxPrimitiveCount;

#ifdef DILIGENT_DEVELOPMENT
#    if DILIGENT_USE_VOLK
                {
                    VkFormatProperties2 vkProps{};
                    vkProps.sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_2;
                    vkGetPhysicalDeviceFormatProperties2KHR(PhysicalDevice.GetVkDeviceHandle(), tri.vertexFormat, &vkProps);

                    DEV_CHECK_ERR((vkProps.formatProperties.bufferFeatures & VK_FORMAT_FEATURE_ACCELERATION_STRUCTURE_VERTEX_BUFFER_BIT_KHR) != 0,
                                  "combination of pTriangles[", i, "].VertexValueType (", GetValueTypeString(src.VertexValueType),
                                  ") and pTriangles[", i, "].VertexComponentCount (", src.VertexComponentCount, ") is not supported by this device.");
                }
#    else
                UNSUPPORTED("vkGetPhysicalDeviceFormatProperties2KHR is only available through Volk");
#    endif
#endif
            }
            DEV_CHECK_ERR(MaxPrimitiveCount <= RTProps.MaxPrimitivesPerBLAS,
                          "Max primitives count (", MaxPrimitiveCount, ") exceeds device limit (", RTProps.MaxPrimitivesPerBLAS, ")");
            (void)MaxPrimitiveCount;
        }
        else if (m_Desc.pBoxes != nullptr)
        {
            Uint32 MaxBoxCount = 0;
            for (uint32_t i = 0; i < m_Desc.BoxCount; ++i)
            {
                auto& src = m_Desc.pBoxes[i];
                auto& dst = vkGeometries[i];
                auto& box = dst.geometry.aabbs;

                dst.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
                dst.pNext        = nullptr;
                dst.geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;

                box.sType             = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
                box.pNext             = nullptr;
                MaxPrimitiveCounts[i] = src.MaxBoxCount;

                MaxBoxCount += src.MaxBoxCount;
            }
            DEV_CHECK_ERR(MaxBoxCount <= RTProps.MaxPrimitivesPerBLAS,
                          "Max box count (", MaxBoxCount, ") exceeds device limit (", RTProps.MaxPrimitivesPerBLAS, ")");
            (void)MaxBoxCount;
        }
        else
        {
            UNEXPECTED("Either pTriangles or pBoxes must not be null");
        }

        vkBuildInfo.sType         = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
        vkBuildInfo.flags         = BuildASFlagsToVkBuildAccelerationStructureFlags(m_Desc.Flags);
        vkBuildInfo.type          = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;
        vkBuildInfo.pGeometries   = vkGeometries.data();
        vkBuildInfo.geometryCount = static_cast<uint32_t>(vkGeometries.size());

        DEV_CHECK_ERR(vkBuildInfo.geometryCount <= RTProps.MaxGeometriesPerBLAS, "Geometry count (", vkBuildInfo.geometryCount,
                      ") exceeds device limit (", RTProps.MaxGeometriesPerBLAS, ").");

        LogicalDevice.GetAccelerationStructureBuildSizes(vkBuildInfo, MaxPrimitiveCounts.data(), vkSizeInfo);

        AccelStructSize      = vkSizeInfo.accelerationStructureSize;
        m_ScratchSize.Build  = vkSizeInfo.buildScratchSize;
        m_ScratchSize.Update = vkSizeInfo.updateScratchSize;
    }

    VkBufferCreateInfo vkBuffCI{};
    vkBuffCI.sType                 = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    vkBuffCI.flags                 = 0;
    vkBuffCI.size                  = AccelStructSize;
    vkBuffCI.usage                 = VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_STORAGE_BIT_KHR | VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
    vkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    vkBuffCI.queueFamilyIndexCount = 0;
    vkBuffCI.pQueueFamilyIndices   = nullptr;

    m_VulkanBuffer = LogicalDevice.CreateBuffer(vkBuffCI, m_Desc.Name);

    VkMemoryRequirements MemReqs         = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);
    uint32_t             MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

    VERIFY(IsPowerOfTwo(MemReqs.alignment), "Alignment is not power of 2!");
    m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, MemReqs.alignment, MemoryTypeIndex, VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for BLAS '", m_Desc.Name, "'.");

    m_MemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, MemReqs.alignment);
    VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_MemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
    auto Memory = m_MemoryAllocation.Page->GetVkMemory();
    auto err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_MemoryAlignedOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

    VkAccelerationStructureCreateInfoKHR vkAccelStrCI{};
    vkAccelStrCI.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
    vkAccelStrCI.createFlags = 0;
    vkAccelStrCI.buffer      = m_VulkanBuffer;
    vkAccelStrCI.offset      = 0;
    vkAccelStrCI.size        = AccelStructSize;
    vkAccelStrCI.type        = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;

    m_VulkanBLAS = LogicalDevice.CreateAccelStruct(vkAccelStrCI, m_Desc.Name);

    m_DeviceAddress = LogicalDevice.GetAccelerationStructureDeviceAddress(m_VulkanBLAS);

    SetState(RESOURCE_STATE_BUILD_AS_READ);
}